

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::SRGBTestCase
          (SRGBTestCase *this,Context *context,char *name,char *description,
          TextureFormat internalFormat)

{
  char *description_local;
  char *name_local;
  Context *context_local;
  SRGBTestCase *this_local;
  TextureFormat internalFormat_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SRGBTestCase_032b1c30;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr(&this->m_framebuffer);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ::vector(&this->m_textureSourceList);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  ::vector(&this->m_samplerList);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_renderBufferList);
  tcu::Vector<float,_4>::Vector(&this->m_epsilonError,0.005);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::vector
            (&this->m_textureResultList);
  tcu::TextureFormat::TextureFormat(&this->m_resultTextureFormat,sRGBA,UNORM_INT8);
  this->m_vaoID = 0;
  this->m_vertexDataID = 0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FragmentShaderParameters>_>
  ::vector(&this->m_shaderParametersList);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestProgram_*>_>
  ::vector(&this->m_shaderProgramList);
  this->m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  this->m_internalFormat = internalFormat;
  return;
}

Assistant:

SRGBTestCase::SRGBTestCase	(Context& context, const char* name, const char* description, const tcu::TextureFormat internalFormat)
	: TestCase				(context, name, description)
	, m_epsilonError		(EpsilonError::CPU)
	, m_resultTextureFormat	(tcu::TextureFormat(tcu::TextureFormat::sRGBA, tcu::TextureFormat::UNORM_INT8))
	, m_vaoID				(0)
	, m_vertexDataID		(0)
	, m_samplingGroup		(SHADERSAMPLINGGROUP_TEXTURE)
	, m_internalFormat		(internalFormat)
{
}